

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstrumentPass::AddParameters
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstrumentPass *this,Function *func,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  pointer ppTVar1;
  Type *type;
  iterator __position;
  IRContext *pIVar2;
  pointer ppTVar3;
  uint32_t pid;
  uint32_t local_74;
  Instruction *local_70;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_68;
  uint32_t local_60;
  Op local_5c;
  Function *local_58;
  IRContext *local_50;
  initializer_list<spvtools::opt::Operand> local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = func;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,
             (long)(param_types->
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(param_types->
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppTVar3 = (param_types->
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (param_types->
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar3 != ppTVar1) {
    local_58 = (Function *)&local_58->params_;
    do {
      type = *ppTVar3;
      local_74 = Pass::TakeNextId(&this->super_Pass);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,&local_74);
      }
      else {
        *__position._M_current = local_74;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pIVar2 = (this->super_Pass).context_;
      local_5c = OpFunctionParameter;
      local_50 = pIVar2;
      if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(pIVar2);
      }
      local_60 = analysis::TypeManager::GetId
                           ((pIVar2->type_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                            _M_head_impl,type);
      local_48._M_array = (iterator)0x0;
      local_48._M_len = 0;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_70,&local_50,&local_5c,&local_60,&local_74,&local_48);
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar2->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,local_70);
      local_68._M_head_impl = local_70;
      local_70 = (Instruction *)0x0;
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)local_58,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*((local_68._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      local_68._M_head_impl = (Instruction *)0x0;
      if (local_70 != (Instruction *)0x0) {
        (*(local_70->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1]
        )();
      }
      ppTVar3 = ppTVar3 + 1;
    } while (ppTVar3 != ppTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> InstrumentPass::AddParameters(
    Function& func, const std::vector<const analysis::Type*>& param_types) {
  std::vector<uint32_t> param_ids;
  param_ids.reserve(param_types.size());
  for (const analysis::Type* param : param_types) {
    uint32_t pid = TakeNextId();
    param_ids.push_back(pid);
    auto param_inst =
        MakeUnique<Instruction>(context(), spv::Op::OpFunctionParameter,
                                context()->get_type_mgr()->GetId(param), pid,
                                std::initializer_list<Operand>{});
    get_def_use_mgr()->AnalyzeInstDefUse(param_inst.get());
    func.AddParameter(std::move(param_inst));
  }
  return param_ids;
}